

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

ecs_bucket_t * get_bucket(ecs_map_t *map,ecs_map_key_t key)

{
  int bucket_count_00;
  int32_t iVar1;
  int32_t bucket_id;
  int32_t bucket_count;
  ecs_map_key_t key_local;
  ecs_map_t *map_local;
  
  bucket_count_00 = map->bucket_count;
  if (bucket_count_00 == 0) {
    map_local = (ecs_map_t *)0x0;
  }
  else {
    iVar1 = get_bucket_id(bucket_count_00,key);
    _ecs_assert(iVar1 < bucket_count_00,0xc,(char *)0x0,"bucket_id < bucket_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x37);
    if (bucket_count_00 <= iVar1) {
      __assert_fail("bucket_id < bucket_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                    ,0x37,"ecs_bucket_t *get_bucket(const ecs_map_t *, ecs_map_key_t)");
    }
    map_local = (ecs_map_t *)(map->buckets + iVar1);
  }
  return (ecs_bucket_t *)map_local;
}

Assistant:

static
ecs_bucket_t* get_bucket(
    const ecs_map_t *map,
    ecs_map_key_t key)
{
    int32_t bucket_count = map->bucket_count;
    if (!bucket_count) {
        return NULL;
    }

    int32_t bucket_id = get_bucket_id(bucket_count, key);
    ecs_assert(bucket_id < bucket_count, ECS_INTERNAL_ERROR, NULL);

    return &map->buckets[bucket_id];
}